

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2AnimationBlock(Parser *this,BaseNode *mesh)

{
  Animation *pAVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Logger *pLVar6;
  long lVar7;
  char *message;
  Animation *anim;
  byte *pbVar8;
  byte *pbVar9;
  string temp;
  string local_50;
  
  anim = &mesh->mAnim;
  pAVar1 = &mesh->mTargetAnim;
  iVar5 = 0;
LAB_004020e7:
  pbVar9 = (byte *)this->filePtr;
  do {
    bVar2 = *pbVar9;
    pbVar8 = pbVar9;
    if (bVar2 == 0x2a) {
      do {
        pbVar9 = pbVar8 + 1;
        this->filePtr = (char *)pbVar9;
        iVar4 = strncmp("NODE_NAME",(char *)pbVar9,9);
        if (iVar4 == 0) {
          bVar2 = pbVar8[10];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            this->filePtr = (char *)(pbVar8 + (0xb - (ulong)(bVar2 == 0)));
            local_50._M_string_length = 0;
            local_50.field_2._M_local_buf[0] = '\0';
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            bVar3 = ParseString(this,&local_50,"*NODE_NAME");
            if (!bVar3) {
              SkipToNextToken(this);
            }
            lVar7 = std::__cxx11::string::find((char *)&local_50,0x6bdfed,0);
            if (lVar7 != -1) {
              if (mesh->mType == Light) {
                iVar4 = *(int *)&mesh->field_0x154;
LAB_00402519:
                anim = pAVar1;
                if (iVar4 == 1) goto LAB_00402537;
              }
              else if (mesh->mType == Camera) {
                iVar4 = *(int *)&mesh[1].mName._M_dataplus._M_p;
                goto LAB_00402519;
              }
              pLVar6 = DefaultLogger::get();
              Logger::error(pLVar6,
                            "ASE: Found target animation channel but the node is neither a camera nor a spot light"
                           );
              anim = (Animation *)0x0;
            }
LAB_00402537:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                       local_50.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_004020e7;
          }
        }
        iVar4 = strncmp("CONTROL_POS_TRACK",(char *)pbVar9,0x11);
        if (iVar4 == 0) {
          bVar2 = pbVar8[0x12];
          if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
          goto LAB_00402157;
          pbVar9 = pbVar8 + 0x12;
          lVar7 = 0x13;
LAB_004022c8:
          pbVar8 = pbVar8 + lVar7;
          if (bVar2 == 0) {
            pbVar8 = pbVar9;
          }
          this->filePtr = (char *)pbVar8;
          if (anim == (Animation *)0x0) goto LAB_004023f1;
          ParseLV3PosAnimationBlock(this,anim);
        }
        else {
LAB_00402157:
          iVar4 = strncmp("CONTROL_POS_BEZIER",(char *)pbVar9,0x12);
          if (iVar4 == 0) {
            bVar2 = pbVar8[0x13];
            if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
              pbVar9 = pbVar8 + 0x13;
              lVar7 = 0x14;
              goto LAB_004022c8;
            }
          }
          iVar4 = strncmp("CONTROL_POS_TCB",(char *)pbVar9,0xf);
          if (iVar4 == 0) {
            bVar2 = pbVar8[0x10];
            if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
              pbVar9 = pbVar8 + 0x10;
              lVar7 = 0x11;
              goto LAB_004022c8;
            }
          }
          iVar4 = strncmp("CONTROL_SCALE_TRACK",(char *)pbVar9,0x13);
          if (iVar4 == 0) {
            bVar2 = pbVar8[0x14];
            if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
            goto LAB_004021ab;
            pbVar9 = pbVar8 + 0x14;
            lVar7 = 0x15;
LAB_00402357:
            pbVar8 = pbVar8 + lVar7;
            if (bVar2 == 0) {
              pbVar8 = pbVar9;
            }
            this->filePtr = (char *)pbVar8;
            if (anim != pAVar1 && anim != (Animation *)0x0) {
              ParseLV3ScaleAnimationBlock(this,anim);
              goto LAB_004023f9;
            }
            pLVar6 = DefaultLogger::get();
            message = "ASE: Ignoring scaling channel in target animation";
          }
          else {
LAB_004021ab:
            iVar4 = strncmp("CONTROL_SCALE_BEZIER",(char *)pbVar9,0x14);
            if (iVar4 == 0) {
              bVar2 = pbVar8[0x15];
              if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                pbVar9 = pbVar8 + 0x15;
                lVar7 = 0x16;
                goto LAB_00402357;
              }
            }
            iVar4 = strncmp("CONTROL_SCALE_TCB",(char *)pbVar9,0x11);
            if (iVar4 == 0) {
              bVar2 = pbVar8[0x12];
              if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                pbVar9 = pbVar8 + 0x12;
                lVar7 = 0x13;
                goto LAB_00402357;
              }
            }
            iVar4 = strncmp("CONTROL_ROT_TRACK",(char *)pbVar9,0x11);
            if (iVar4 == 0) {
              bVar2 = pbVar8[0x12];
              if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
              goto LAB_004021ff;
              pbVar9 = pbVar8 + 0x12;
              lVar7 = 0x13;
            }
            else {
LAB_004021ff:
              iVar4 = strncmp("CONTROL_ROT_BEZIER",(char *)pbVar9,0x12);
              if (iVar4 == 0) {
                bVar2 = pbVar8[0x13];
                if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
                  pbVar9 = pbVar8 + 0x13;
                  lVar7 = 0x14;
                  goto LAB_004023cc;
                }
              }
              iVar4 = strncmp("CONTROL_ROT_TCB",(char *)pbVar9,0xf);
              if (iVar4 != 0) break;
              bVar2 = pbVar8[0x10];
              if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
              break;
              pbVar9 = pbVar8 + 0x10;
              lVar7 = 0x11;
            }
LAB_004023cc:
            pbVar8 = pbVar8 + lVar7;
            if (bVar2 == 0) {
              pbVar8 = pbVar9;
            }
            this->filePtr = (char *)pbVar8;
            if (anim != pAVar1 && anim != (Animation *)0x0) {
              ParseLV3RotAnimationBlock(this,anim);
              goto LAB_004023f9;
            }
            pLVar6 = DefaultLogger::get();
            message = "ASE: Ignoring rotation channel in target animation";
          }
          Logger::error(pLVar6,message);
LAB_004023f1:
          SkipSection(this);
        }
LAB_004023f9:
        pbVar9 = (byte *)this->filePtr;
        pbVar8 = pbVar9;
      } while (*pbVar9 == 0x2a);
      bVar2 = *pbVar9;
    }
    bVar3 = false;
    if (bVar2 < 0x7b) {
      if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_0040246b;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar2 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a TM_ANIMATION chunk (Level 2)");
      }
    }
    else {
      if (bVar2 == 0x7d) {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          this->filePtr = (char *)(pbVar9 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar2 != 0x7b) goto LAB_0040246d;
        iVar5 = iVar5 + 1;
      }
LAB_0040246b:
      bVar3 = false;
    }
LAB_0040246d:
    this->bLastWasEndLine = bVar3;
    pbVar9 = pbVar9 + 1;
    this->filePtr = (char *)pbVar9;
  } while( true );
}

Assistant:

void Parser::ParseLV2AnimationBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();

    ASE::Animation* anim = &mesh.mAnim;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                // If the name of the node contains .target it
                // represents an animated camera or spot light
                // target.
                if (std::string::npos != temp.find(".Target"))
                {
                    if  ((mesh.mType != BaseNode::Camera || ((ASE::Camera&)mesh).mCameraType != ASE::Camera::TARGET)  &&
                        ( mesh.mType != BaseNode::Light  || ((ASE::Light&)mesh).mLightType   != ASE::Light::TARGET))
                    {

                        ASSIMP_LOG_ERROR("ASE: Found target animation channel "
                            "but the node is neither a camera nor a spot light");
                        anim = NULL;
                    }
                    else anim = &mesh.mTargetAnim;
                }
                continue;
            }

            // position keyframes
            if (TokenMatch(filePtr,"CONTROL_POS_TRACK"  ,17)  ||
                TokenMatch(filePtr,"CONTROL_POS_BEZIER" ,18)  ||
                TokenMatch(filePtr,"CONTROL_POS_TCB"    ,15))
            {
                if (!anim)SkipSection();
                else ParseLV3PosAnimationBlock(*anim);
                continue;
            }
            // scaling keyframes
            if (TokenMatch(filePtr,"CONTROL_SCALE_TRACK"  ,19) ||
                TokenMatch(filePtr,"CONTROL_SCALE_BEZIER" ,20) ||
                TokenMatch(filePtr,"CONTROL_SCALE_TCB"    ,17))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring scaling channel in target animation");
                    SkipSection();
                }
                else ParseLV3ScaleAnimationBlock(*anim);
                continue;
            }
            // rotation keyframes
            if (TokenMatch(filePtr,"CONTROL_ROT_TRACK"  ,17) ||
                TokenMatch(filePtr,"CONTROL_ROT_BEZIER" ,18) ||
                TokenMatch(filePtr,"CONTROL_ROT_TCB"    ,15))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring rotation channel in target animation");
                    SkipSection();
                }
                else ParseLV3RotAnimationBlock(*anim);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","TM_ANIMATION");
    }
}